

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O3

void __thiscall cfd::core::Deserializer::CheckReadSize(Deserializer *this,uint64_t size)

{
  CfdException *pCVar1;
  undefined1 local_40 [32];
  
  if (size >> 0x20 != 0) {
    local_40._0_8_ = "cfdcore_bytedata.cpp";
    local_40._8_4_ = 0x2a1;
    local_40._16_8_ = "CheckReadSize";
    logger::log<>((CfdSourceLocation *)local_40,kCfdLogLevelWarning,"It exceeds the handling size.")
    ;
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    local_40._0_8_ = local_40 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"It exceeds the handling size.","");
    CfdException::CfdException(pCVar1,kCfdIllegalStateError,(string *)local_40);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (this->offset_ + size <=
      (ulong)((long)(this->buffer_).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start)) {
    return;
  }
  local_40._0_8_ = "cfdcore_bytedata.cpp";
  local_40._8_4_ = 0x2a5;
  local_40._16_8_ = "CheckReadSize";
  logger::log<>((CfdSourceLocation *)local_40,kCfdLogLevelWarning,"deserialize buffer EOF.");
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  local_40._0_8_ = local_40 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"deserialize buffer EOF.","")
  ;
  CfdException::CfdException(pCVar1,kCfdIllegalStateError,(string *)local_40);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Deserializer::CheckReadSize(uint64_t size) {
  if (size > std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "It exceeds the handling size.");
    throw CfdException(kCfdIllegalStateError, "It exceeds the handling size.");
  }
  if (buffer_.size() < (offset_ + size)) {
    warn(CFD_LOG_SOURCE, "deserialize buffer EOF.");
    throw CfdException(kCfdIllegalStateError, "deserialize buffer EOF.");
  }
}